

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType2.cpp
# Opt level: O1

void __thiscall KDIS::DATA_TYPE::GridDataType2::Decode(GridDataType2 *this,KDataStream *stream)

{
  undefined1 *T;
  pointer pfVar1;
  iterator __position;
  KUINT16 KVar2;
  KException *this_00;
  ushort uVar3;
  KFLOAT32 tmp;
  KString local_50;
  
  KVar2 = KDataStream::GetBufferSize(stream);
  if (7 < KVar2) {
    pfVar1 = (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_finish != pfVar1) {
      (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_finish = pfVar1;
    }
    GridData::Decode(&this->super_GridData,stream);
    T = &(this->super_GridData).field_0xc;
    KDataStream::Read<unsigned_short>(stream,(unsigned_short *)T);
    local_50._M_dataplus._M_p = (pointer)((ulong)local_50._M_dataplus._M_p._4_4_ << 0x20);
    if (*(short *)&(this->super_GridData).field_0xc != 0) {
      uVar3 = 0;
      do {
        KDataStream::Read<float>(stream,(float *)&local_50);
        __position._M_current =
             (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                    ((vector<float,std::allocator<float>> *)&this->m_vf32Values,__position,
                     (float *)&local_50);
        }
        else {
          *__position._M_current = local_50._M_dataplus._M_p._0_4_;
          (this->m_vf32Values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < *(ushort *)T);
    }
    KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Decode","");
  KException::KException(this_00,&local_50,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void GridDataType2::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < GRID_DATA_TYPE2_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vf32Values.clear();

    GridData::Decode( stream );

    stream >> m_ui16NumValues;

    KFLOAT32 tmp = 0;
    for( KUINT16 i = 0; i < m_ui16NumValues; ++i )
    {
        stream >> tmp;
        m_vf32Values.push_back( tmp );
    }

    stream >> m_ui16Padding;
}